

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O3

bool __thiscall Diligent::DeviceObjectArchive::Deserialize(DeviceObjectArchive *this,CreateInfo *CI)

{
  Uint32 UVar1;
  IDataBlob *pObj;
  uint uVar2;
  bool bVar3;
  TEnableStr<const_char_*> TVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *ResData;
  char (*Args_1) [16];
  undefined1 *puVar7;
  char (*in_R8) [3];
  uint *in_R9;
  uint uVar8;
  long lVar9;
  string _msg;
  Uint32 NumResources;
  char *Name;
  ResourceType ResType;
  ArchiveSerializer<(Diligent::SerializerMode)0> ArchiveReader;
  Serializer<(Diligent::SerializerMode)0> Reader;
  ResourceType in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 local_a0 [24];
  uint local_88;
  undefined1 local_81;
  char *local_80;
  ResourceType local_78;
  uint local_74;
  ArchiveSerializer<(Diligent::SerializerMode)0> local_70;
  undefined8 local_68;
  uint uStack_60;
  Uint32 UStack_5c;
  char *local_58 [2];
  Serializer<(Diligent::SerializerMode)0> local_48;
  
  Clear(this);
  pObj = CI->pData;
  if (pObj == (IDataBlob *)0x0) {
    FormatString<char[23]>
              ((string *)&stack0xffffffffffffff58,(char (*) [23])"pData must not be null");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)
                (2,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0,0,0);
    }
  }
  else {
    if (CI->MakeCopy == true) {
      DataBlobImpl::MakeCopy((DataBlobImpl *)&stack0xffffffffffffff58,pObj);
      RefCntAutoPtr<Diligent::IDataBlob>::operator=
                (&this->m_pArchiveData,
                 (IDataBlob *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      RefCntAutoPtr<Diligent::DataBlobImpl>::Release
                ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&stack0xffffffffffffff58);
    }
    else {
      RefCntAutoPtr<Diligent::IDataBlob>::operator=(&this->m_pArchiveData,pObj);
    }
    iVar5 = (*(CI->pData->super_IObject)._vptr_IObject[7])(CI->pData,0);
    iVar6 = (*(CI->pData->super_IObject)._vptr_IObject[5])();
    SerializedData::SerializedData
              ((SerializedData *)&stack0xffffffffffffff58,(void *)CONCAT44(extraout_var,iVar5),
               CONCAT44(extraout_var_00,iVar6));
    local_48.m_Start = (TPointer)local_a0._0_8_;
    local_48.m_End = (TPointer)((long)(local_a0._0_8_ + 8) + (long)(local_a0._8_8_ - 8));
    local_48.m_Ptr = (TPointer)local_a0._0_8_;
    SerializedData::~SerializedData((SerializedData *)&stack0xffffffffffffff58);
    local_68 = (pointer)0x8de00000a;
    uStack_60._0_1_ = '\b';
    uStack_60._1_1_ = -0x18;
    uStack_60._2_1_ = '\x03';
    uStack_60._3_1_ = '\0';
    UStack_5c._0_1_ = '\0';
    UStack_5c._1_1_ = '\0';
    UStack_5c._2_1_ = '\0';
    UStack_5c._3_1_ = '\0';
    local_58[0] = "9c77d7ae";
    local_70.Ser = &local_48;
    bVar3 = Serializer<(Diligent::SerializerMode)0>::Copy<unsigned_int>
                      (&local_48,(uint *)&local_68,4);
    if (bVar3) {
      if ((uint)local_68 == 0xde00000a) {
        bVar3 = Serializer<(Diligent::SerializerMode)0>::Copy<unsigned_int>
                          (&local_48,(uint *)((long)&local_68 + 4),4);
        if (bVar3) {
          if (local_68._4_4_ == 8) {
            bVar3 = Serializer<(Diligent::SerializerMode)0>::Copy<unsigned_int>
                              (&local_48,&uStack_60,4);
            if (bVar3) {
              bVar3 = Serializer<(Diligent::SerializerMode)0>::Copy<unsigned_int>
                                (&local_48,(uint *)&UStack_5c,4);
              if (bVar3) {
                UVar1 = CI->ContentVersion;
                Args_1 = (char (*) [16])
                         (ulong)CONCAT31((int3)(UVar1 >> 8),
                                         UStack_5c != UVar1 && UVar1 != 0xffffffff);
                if (UStack_5c != UVar1 && UVar1 != 0xffffffff) {
                  FormatString<char[34],unsigned_int,char[21],unsigned_int>
                            ((string *)&stack0xffffffffffffff58,
                             (Diligent *)"Invalid archive content version: ",
                             (char (*) [34])&UStack_5c,(uint *)". Expected version: ",
                             (char (*) [21])&CI->ContentVersion,in_R9);
                  if (DebugMessageCallback != (undefined *)0x0) {
                    (*(code *)DebugMessageCallback)
                              (2,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0,0,0
                              );
                  }
                }
                else {
                  this->m_ContentVersion = UStack_5c;
                  TVar4 = Serializer<(Diligent::SerializerMode)0>::Serialize<char_const*>
                                    (&local_48,local_58);
                  if (TVar4) {
                    local_88 = 0;
                    bVar3 = Serializer<(Diligent::SerializerMode)0>::Copy<unsigned_int>
                                      (&local_48,&local_88,4);
                    if (bVar3) {
                      local_74 = 0;
                      if (local_88 != 0) {
                        uVar2 = 1;
                        do {
                          uVar8 = uVar2;
                          local_80 = (Char *)0x0;
                          local_78 = Undefined;
                          bVar3 = Serializer<(Diligent::SerializerMode)0>::operator()
                                            (&local_48,&local_78,&local_80);
                          if (!bVar3) {
                            local_81 = 0x2e;
                            FormatString<char[46],unsigned_int,char[2],unsigned_int,char>
                                      ((string *)&stack0xffffffffffffff58,
                                       (Diligent *)"Failed to read the type and name of resource ",
                                       (char (*) [46])&local_74,(uint *)0x6d59b5,
                                       (char (*) [2])&local_88,(uint *)&local_81,
                                       (char *)CONCAT44(in_stack_ffffffffffffff5c,
                                                        in_stack_ffffffffffffff58));
                            if (DebugMessageCallback != (undefined *)0x0) {
                              (*(code *)DebugMessageCallback)
                                        (2,CONCAT44(in_stack_ffffffffffffff5c,
                                                    in_stack_ffffffffffffff58),0,0,0);
                            }
LAB_004919e9:
                            puVar7 = (undefined1 *)
                                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
                            goto LAB_00491709;
                          }
                          if (local_80 == (Char *)0x0) {
                            FormatString<char[26],char[16]>
                                      ((string *)&stack0xffffffffffffff58,
                                       (Diligent *)"Debug expression failed:\n",
                                       (char (*) [26])0x6d1201,Args_1);
                            Args_1 = (char (*) [16])0xdd;
                            DebugAssertionFailed
                                      ((Char *)CONCAT44(in_stack_ffffffffffffff5c,
                                                        in_stack_ffffffffffffff58),"Deserialize",
                                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                                       ,0xdd);
                            if ((undefined1 *)
                                CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58) !=
                                local_a0 + 8) {
                              operator_delete((undefined1 *)
                                              CONCAT44(in_stack_ffffffffffffff5c,
                                                       in_stack_ffffffffffffff58),
                                              (ulong)(local_a0._8_8_ + 1));
                            }
                          }
                          in_stack_ffffffffffffff58 = local_78;
                          HashMapStringKey::HashMapStringKey
                                    ((HashMapStringKey *)local_a0,local_80,false);
                          ResData = std::__detail::
                                    _Map_base<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    ::operator[]((_Map_base<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                  *)this,(key_type *)&stack0xffffffffffffff58);
                          if (((RefCountersImpl *)local_a0._0_8_ != (RefCountersImpl *)0x0) &&
                             ((long)local_a0._8_8_ < 0)) {
                            operator_delete__((void *)local_a0._0_8_);
                          }
                          bVar3 = anon_unknown_25::ArchiveSerializer<(Diligent::SerializerMode)0>::
                                  SerializeResourceData(&local_70,ResData);
                          if (!bVar3) {
                            FormatString<char[34],char_const*,char[3]>
                                      ((string *)&stack0xffffffffffffff58,
                                       (Diligent *)"Failed to read data of resource \'",
                                       (char (*) [34])&local_80,(char **)"\'.",in_R8);
                            if (DebugMessageCallback != (undefined *)0x0) {
                              (*(code *)DebugMessageCallback)
                                        (2,CONCAT44(in_stack_ffffffffffffff5c,
                                                    in_stack_ffffffffffffff58),0,0,0);
                            }
                            goto LAB_004919e9;
                          }
                          uVar2 = uVar8 + 1;
                          local_74 = uVar8;
                        } while (uVar8 < local_88);
                      }
                      lVar9 = 0x38;
                      while (bVar3 = anon_unknown_25::ArchiveSerializer<(Diligent::SerializerMode)0>
                                     ::SerializeShaders(&local_70,
                                                        (ShadersVector *)
                                                        ((long)(this->m_DeviceShaders)._M_elems +
                                                        lVar9 + -0x38)), bVar3) {
                        lVar9 = lVar9 + 0x18;
                        if (lVar9 == 0xe0) {
                          return true;
                        }
                      }
                      FormatString<char[59]>
                                ((string *)&stack0xffffffffffffff58,
                                 (char (*) [59])
                                 "Failed to read shader data from the device object archive.");
                      if (DebugMessageCallback != (undefined *)0x0) {
                        (*(code *)DebugMessageCallback)
                                  (2,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0
                                   ,0,0);
                      }
                    }
                    else {
                      FormatString<char[75]>
                                ((string *)&stack0xffffffffffffff58,
                                 (char (*) [75])
                                 "Failed to read the number of named resources in the device object archive."
                                );
                      if (DebugMessageCallback != (undefined *)0x0) {
                        (*(code *)DebugMessageCallback)
                                  (2,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0
                                   ,0,0);
                      }
                    }
                  }
                  else {
                    FormatString<char[25]>
                              ((string *)&stack0xffffffffffffff58,
                               (char (*) [25])"Failed to read Git Hash.");
                    if (DebugMessageCallback != (undefined *)0x0) {
                      (*(code *)DebugMessageCallback)
                                (2,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0,0
                                 ,0);
                    }
                  }
                }
              }
              else {
                FormatString<char[54]>
                          ((string *)&stack0xffffffffffffff58,
                           (char (*) [54])"Failed to read device object archive content version.");
                if (DebugMessageCallback != (undefined *)0x0) {
                  (*(code *)DebugMessageCallback)
                            (2,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0,0,0);
                }
              }
            }
            else {
              FormatString<char[37]>
                        ((string *)&stack0xffffffffffffff58,
                         (char (*) [37])"Failed to read Diligent API version.");
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)
                          (2,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0,0,0);
              }
            }
          }
          else {
            local_80 = (char *)CONCAT44(local_80._4_4_,8);
            FormatString<char[44],unsigned_int,char[21],unsigned_int>
                      ((string *)&stack0xffffffffffffff58,
                       (Diligent *)"Unsupported device object archive version: ",
                       (char (*) [44])((long)&local_68 + 4),(uint *)". Expected version: ",
                       (char (*) [21])&local_80,in_R9);
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)
                        (2,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0,0,0);
            }
          }
        }
        else {
          FormatString<char[46]>
                    ((string *)&stack0xffffffffffffff58,
                     (char (*) [46])"Failed to read device object archive version.");
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)
                      (2,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0,0,0);
          }
        }
      }
      else {
        FormatString<char[38]>
                  ((string *)&stack0xffffffffffffff58,
                   (char (*) [38])"Invalid device object archive header.");
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)
                    (2,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0,0,0);
        }
      }
    }
    else {
      FormatString<char[58]>
                ((string *)&stack0xffffffffffffff58,
                 (char (*) [58])"Failed to read device object archive header magic number.");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)
                  (2,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0,0,0);
      }
    }
  }
  puVar7 = (undefined1 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
LAB_00491709:
  if (puVar7 != local_a0 + 8) {
    operator_delete(puVar7,(ulong)(local_a0._8_8_ + 1));
  }
  Clear(this);
  return false;
}

Assistant:

bool DeviceObjectArchive::Deserialize(const CreateInfo& CI) noexcept
{
    Clear();

#define CHECK_ARCHIVE(Expr, ...)            \
    do                                      \
    {                                       \
        if (!(Expr))                        \
        {                                   \
            LOG_ERROR_MESSAGE(__VA_ARGS__); \
            Clear();                        \
            return false;                   \
        }                                   \
    } while (false)

    CHECK_ARCHIVE(CI.pData != nullptr, "pData must not be null");

    m_pArchiveData = CI.MakeCopy ?
        DataBlobImpl::MakeCopy(CI.pData) :
        const_cast<IDataBlob*>(CI.pData); // Need to remove const for AddRef/Release

    Serializer<SerializerMode::Read> Reader{
        SerializedData{
            const_cast<void*>(CI.pData->GetConstDataPtr()),
            CI.pData->GetSize(),
        },
    };
    ArchiveSerializer<SerializerMode::Read> ArchiveReader{Reader};

    // NB: this must match header serialization in DeviceObjectArchive::SerializeHeader
    ArchiveHeader Header;
    ASSERT_SIZEOF64(Header, 24, "Please handle new members here");
    CHECK_ARCHIVE(ArchiveReader.Ser(Header.MagicNumber), "Failed to read device object archive header magic number.");

    CHECK_ARCHIVE(Header.MagicNumber == HeaderMagicNumber, "Invalid device object archive header.");

    CHECK_ARCHIVE(ArchiveReader.Ser(Header.Version), "Failed to read device object archive version.");

    CHECK_ARCHIVE(Header.Version == ArchiveVersion, "Unsupported device object archive version: ", Header.Version, ". Expected version: ", Uint32{ArchiveVersion});

    CHECK_ARCHIVE(ArchiveReader.Ser(Header.APIVersion), "Failed to read Diligent API version.");

    CHECK_ARCHIVE(ArchiveReader.Ser(Header.ContentVersion), "Failed to read device object archive content version.");

    CHECK_ARCHIVE(CI.ContentVersion == CreateInfo{}.ContentVersion || Header.ContentVersion == CI.ContentVersion,
                  "Invalid archive content version: ", Header.ContentVersion, ". Expected version: ", CI.ContentVersion);
    m_ContentVersion = Header.ContentVersion;

    CHECK_ARCHIVE(ArchiveReader.Ser(Header.GitHash), "Failed to read Git Hash.");

    Uint32 NumResources = 0;
    CHECK_ARCHIVE(Reader(NumResources), "Failed to read the number of named resources in the device object archive.");

    for (Uint32 res = 0; res < NumResources; ++res)
    {
        const char*  Name    = nullptr;
        ResourceType ResType = ResourceType::Undefined;
        CHECK_ARCHIVE(Reader(ResType, Name), "Failed to read the type and name of resource ", res, "/", NumResources, '.');
        VERIFY_EXPR(Name != nullptr);

        // No need to make the name copy as we keep the source data blob alive.
        constexpr bool MakeNameCopy = false;
        ResourceData&  ResData      = m_NamedResources[NamedResourceKey{ResType, Name, MakeNameCopy}];

        CHECK_ARCHIVE(ArchiveReader.SerializeResourceData(ResData), "Failed to read data of resource '", Name, "'.");
    }

    for (std::vector<SerializedData>& Shaders : m_DeviceShaders)
    {
        CHECK_ARCHIVE(ArchiveReader.SerializeShaders(Shaders), "Failed to read shader data from the device object archive.");
    }
#undef CHECK_ARCHIVE

    return true;
}